

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum2.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_preserve_unknown_enum_unittest::MyMessage::_InternalSerialize
          (MyMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  int *piVar2;
  uint32_t uVar3;
  int iVar4;
  const_reference piVar5;
  int *piVar6;
  byte *pbVar7;
  uint8_t *puVar8;
  byte *extraout_RAX;
  ulong in_RCX;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  
  if ((undefined1  [80])((undefined1  [80])this->field_0 & (undefined1  [80])0x1) ==
      (undefined1  [80])0x0) goto LAB_00cecb4c;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  in_RCX = (ulong)(this->field_0)._impl_.e_;
  pbVar7 = target + 1;
  *target = '\b';
  uVar10 = in_RCX;
  if (0x7f < in_RCX) goto LAB_00cece23;
  while( true ) {
    *pbVar7 = (byte)in_RCX;
    target = pbVar7 + 1;
LAB_00cecb4c:
    pRVar1 = &(this->field_0)._impl_.repeated_e_;
    iVar4 = google::protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,
                       (undefined1  [80])((undefined1  [80])this->field_0 & (undefined1  [80])0x4)
                       == (undefined1  [80])0x0);
    if (0 < iVar4) {
      iVar13 = 0;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        piVar5 = google::protobuf::RepeatedField<int>::Get(pRVar1,iVar13);
        in_RCX = (ulong)*piVar5;
        pbVar7 = target + 1;
        *target = 0x10;
        uVar10 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar7 = (byte)uVar10 | 0x80;
            in_RCX = uVar10 >> 7;
            pbVar7 = pbVar7 + 1;
            bVar14 = 0x3fff < uVar10;
            uVar10 = in_RCX;
          } while (bVar14);
        }
        *pbVar7 = (byte)in_RCX;
        target = pbVar7 + 1;
        iVar13 = iVar13 + 1;
      } while (iVar13 != iVar4);
    }
    uVar12 = *(uint *)((long)&this->field_0 + 0x28);
    if (uVar12 == 0) goto LAB_00cecca6;
    pbVar7 = stream->end_;
    if (pbVar7 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar7 = stream->end_;
    }
    if (target < pbVar7) break;
    _InternalSerialize();
    pbVar7 = extraout_RAX;
    uVar10 = in_RCX;
LAB_00cece23:
    do {
      *pbVar7 = (byte)uVar10 | 0x80;
      in_RCX = uVar10 >> 7;
      pbVar7 = pbVar7 + 1;
      bVar14 = 0x3fff < uVar10;
      uVar10 = in_RCX;
    } while (bVar14);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_packed_e_;
  *target = 0x1a;
  pbVar7 = target + 1;
  uVar11 = uVar12;
  if (0x7f < uVar12) {
    do {
      target = pbVar7;
      *target = (byte)uVar11 | 0x80;
      uVar12 = uVar11 >> 7;
      pbVar7 = target + 1;
      bVar14 = 0x3fff < uVar11;
      uVar11 = uVar12;
    } while (bVar14);
  }
  *pbVar7 = (byte)uVar12;
  if ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    piVar6 = (int *)((long)&this->field_0 + 0x20);
    bVar14 = true;
  }
  else {
    piVar6 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
    bVar14 = (undefined1  [16])
             ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
             (undefined1  [16])0x0;
  }
  target = target + 2;
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar14);
  piVar2 = piVar6 + iVar4;
  do {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = (ulong)*piVar6;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *target = (byte)uVar10 | 0x80;
        uVar9 = uVar10 >> 7;
        target = target + 1;
        bVar14 = 0x3fff < uVar10;
        uVar10 = uVar9;
      } while (bVar14);
    }
    piVar6 = piVar6 + 1;
    *target = (byte)uVar9;
    target = target + 1;
  } while (piVar6 < piVar2);
LAB_00cecca6:
  pRVar1 = &(this->field_0)._impl_.repeated_packed_unexpected_e_;
  iVar4 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x30) & 4) == 0);
  if (0 < iVar4) {
    iVar13 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar5 = google::protobuf::RepeatedField<int>::Get(pRVar1,iVar13);
      uVar9 = (ulong)*piVar5;
      pbVar7 = target + 1;
      *target = 0x20;
      uVar10 = uVar9;
      if (0x7f < uVar9) {
        do {
          *pbVar7 = (byte)uVar10 | 0x80;
          uVar9 = uVar10 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar14 = 0x3fff < uVar10;
          uVar10 = uVar9;
        } while (bVar14);
      }
      *pbVar7 = (byte)uVar9;
      target = pbVar7 + 1;
      iVar13 = iVar13 + 1;
    } while (iVar13 != iVar4);
  }
  uVar3 = (this->field_0)._impl_._oneof_case_[0];
  if (uVar3 == 5) {
    if ((target < stream->end_) ||
       (target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target),
       (this->field_0)._impl_._oneof_case_[0] == 5)) {
      uVar9 = (ulong)(this->field_0)._impl_.o_.oneof_e_1_;
      *target = 0x28;
      pbVar7 = target + 1;
      uVar10 = uVar9;
      if (0x7f < uVar9) {
        do {
          *pbVar7 = (byte)uVar10 | 0x80;
          uVar9 = uVar10 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar14 = 0x3fff < uVar10;
          uVar10 = uVar9;
        } while (bVar14);
      }
    }
    else {
      *target = 0x28;
LAB_00ceceb1:
      pbVar7 = target + 1;
      uVar9 = 0;
    }
  }
  else {
    if (uVar3 != 6) goto LAB_00cecda6;
    if ((stream->end_ <= target) &&
       (target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target),
       (this->field_0)._impl_._oneof_case_[0] != 6)) {
      *target = 0x30;
      goto LAB_00ceceb1;
    }
    uVar9 = (ulong)(this->field_0)._impl_.o_.oneof_e_1_;
    *target = 0x30;
    pbVar7 = target + 1;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar7 = (byte)uVar10 | 0x80;
        uVar9 = uVar10 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar14 = 0x3fff < uVar10;
        uVar10 = uVar9;
      } while (bVar14);
    }
  }
  *pbVar7 = (byte)uVar9;
  target = pbVar7 + 1;
LAB_00cecda6:
  uVar10 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar10 & 1) != 0) {
    puVar8 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar10 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar8;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL MyMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const MyMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_preserve_unknown_enum_unittest.MyMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_preserve_unknown_enum_unittest.MyEnum e = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_e(), target);
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_e = 2;
  for (int i = 0, n = this_._internal_repeated_e_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, static_cast<::proto2_preserve_unknown_enum_unittest::MyEnum>(this_._internal_repeated_e().Get(i)),
        target);
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_e = 3 [features = {
  {
    ::size_t byte_size = this_._impl_._repeated_packed_e_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          3, this_._internal_repeated_packed_e(), byte_size, target);
    }
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_unexpected_e = 4;
  for (int i = 0, n = this_._internal_repeated_packed_unexpected_e_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, static_cast<::proto2_preserve_unknown_enum_unittest::MyEnum>(this_._internal_repeated_packed_unexpected_e().Get(i)),
        target);
  }

  switch (this_.o_case()) {
    case kOneofE1: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          5, this_._internal_oneof_e_1(), target);
      break;
    }
    case kOneofE2: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          6, this_._internal_oneof_e_2(), target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_preserve_unknown_enum_unittest.MyMessage)
  return target;
}